

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

string * __thiscall
spirv_cross::Compiler::get_remapped_declared_block_name_abi_cxx11_
          (string *__return_storage_ptr__,Compiler *this,uint32_t id,
          bool fallback_prefer_instance_name)

{
  const_iterator cVar1;
  Meta *pMVar2;
  SPIRVariable *pSVar3;
  SPIRType *pSVar4;
  uint32_t id_local;
  
  id_local = id;
  cVar1 = ::std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->declared_block_names)._M_h,&id_local);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    pSVar3 = get<spirv_cross::SPIRVariable>(this,id_local);
    if (fallback_prefer_instance_name) {
      (*this->_vptr_Compiler[6])
                (__return_storage_ptr__,this,(ulong)(pSVar3->super_IVariant).self.id,1);
      return __return_storage_ptr__;
    }
    pSVar4 = get<spirv_cross::SPIRType>(this,*(uint32_t *)&(pSVar3->super_IVariant).field_0xc);
    pMVar2 = ParsedIR::find_meta(&this->ir,(ID)(pSVar4->super_IVariant).self.id);
    if ((pMVar2 == (Meta *)0x0) || ((pMVar2->decoration).alias._M_string_length == 0)) {
      (*this->_vptr_Compiler[4])(__return_storage_ptr__,this,(ulong)id_local);
      return __return_storage_ptr__;
    }
  }
  else {
    pMVar2 = (Meta *)((long)cVar1.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                            ._M_cur + 0x10);
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pMVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string Compiler::get_remapped_declared_block_name(uint32_t id, bool fallback_prefer_instance_name) const
{
	auto itr = declared_block_names.find(id);
	if (itr != end(declared_block_names))
	{
		return itr->second;
	}
	else
	{
		auto &var = get<SPIRVariable>(id);

		if (fallback_prefer_instance_name)
		{
			return to_name(var.self);
		}
		else
		{
			auto &type = get<SPIRType>(var.basetype);
			auto *type_meta = ir.find_meta(type.self);
			auto *block_name = type_meta ? &type_meta->decoration.alias : nullptr;
			return (!block_name || block_name->empty()) ? get_block_fallback_name(id) : *block_name;
		}
	}
}